

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportPlugin.cpp
# Opt level: O3

void __thiscall
MockSupportPlugin::postTestAction(MockSupportPlugin *this,UtestShell *test,TestResult *result)

{
  int iVar1;
  MockSupport *pMVar2;
  MockSupportPluginReporter reporter;
  SimpleString SStack_38;
  undefined **local_28;
  undefined1 local_20;
  UtestShell *local_18;
  TestResult *local_10;
  
  local_20 = 0;
  local_28 = &PTR__MockFailureReporter_002e6b10;
  local_18 = test;
  local_10 = result;
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x29])(pMVar2,&local_28);
  SimpleString::~SimpleString(&SStack_38);
  iVar1 = (*test->_vptr_UtestShell[7])(test);
  if ((char)iVar1 == '\0') {
    SimpleString::SimpleString(&SStack_38,"");
    pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
    (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
    SimpleString::~SimpleString(&SStack_38);
  }
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x27])(pMVar2);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x29])(pMVar2,0);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

void MockSupportPlugin::postTestAction(UtestShell& test, TestResult& result)
{
    MockSupportPluginReporter reporter(test, result);
    mock().setMockFailureStandardReporter(&reporter);
    if (!test.hasFailed())
        mock().checkExpectations();
    mock().clear();
    mock().setMockFailureStandardReporter(NULLPTR);
    mock().removeAllComparatorsAndCopiers();
}